

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::matchNext
          (GenMatcher *this,uint specVar,TermList nodeTerm,bool separate)

{
  uint *puVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,separate) != 0) {
    if ((this->_boundVars)._cursor == (this->_boundVars)._end) {
      ::Lib::Stack<unsigned_int>::expand(&this->_boundVars);
    }
    puVar1 = (this->_boundVars)._cursor;
    *puVar1 = 0xffffffff;
    (this->_boundVars)._cursor = puVar1 + 1;
  }
  bVar2 = matchNextAux(this,(TermList)(this->_specVars)._array[specVar]._content,nodeTerm,separate);
  return bVar2;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNext(unsigned specVar, TermList nodeTerm, bool separate)
{
  if(separate) {
    _boundVars.push(BACKTRACK_SEPARATOR);
  }

  TermList queryTerm=(_specVars)[specVar];

  return matchNextAux(queryTerm, nodeTerm, separate);
}